

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

Boxed_Value __thiscall chaiscript::const_var(chaiscript *this,bool b)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Boxed_Value BVar3;
  bool local_25 [19];
  bool local_12;
  byte local_11;
  chaiscript *pcStack_10;
  bool b_local;
  
  local_11 = b;
  pcStack_10 = this;
  if (const_var(bool)::t == '\0') {
    iVar1 = __cxa_guard_acquire(&const_var(bool)::t);
    if (iVar1 != 0) {
      local_12 = true;
      detail::const_var_impl<bool>((detail *)&const_var::t,&local_12);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&const_var::t,&__dso_handle);
      __cxa_guard_release(&const_var(bool)::t);
    }
  }
  if (const_var(bool)::f == '\0') {
    iVar1 = __cxa_guard_acquire(&const_var(bool)::f);
    if (iVar1 != 0) {
      local_25[0] = false;
      detail::const_var_impl<bool>((detail *)&const_var::f,local_25);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&const_var::f,&__dso_handle);
      __cxa_guard_release(&const_var(bool)::f);
    }
  }
  if ((local_11 & 1) == 0) {
    Boxed_Value::Boxed_Value((Boxed_Value *)this,&const_var::f);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    Boxed_Value::Boxed_Value((Boxed_Value *)this,&const_var::t);
    _Var2._M_pi = extraout_RDX;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Boxed_Value const_var(bool b) {
    static const auto t = detail::const_var_impl(true);
    static const auto f = detail::const_var_impl(false);

    if (b) {
      return t;
    } else {
      return f;
    }
  }